

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O1

void __thiscall
CChromeTracer::writeDeviceTiming
          (CChromeTracer *this,char *name,uint64_t startTime,uint64_t endTime,uint64_t id)

{
  long lVar1;
  undefined4 uVar3;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar3 = (undefined4)(startTime >> 0x20);
  if (this->m_AddFlowEvents == true) {
    auVar2._8_4_ = uVar3;
    auVar2._0_8_ = startTime;
    auVar2._12_4_ = 0x45300000;
    snprintf(this->m_StringBuffer,0x4000,
             "{\"ph\":\"f\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"Command\",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%lu},\n"
             ,((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)startTime) - 4503599627370496.0)) / 1000.0,
             this->m_ProcessId,name,id);
    std::ostream::write((char *)&this->m_TraceFile,(long)this->m_StringBuffer);
  }
  auVar4._8_4_ = uVar3;
  auVar4._0_8_ = startTime;
  auVar4._12_4_ = 0x45300000;
  lVar1 = endTime - startTime;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  snprintf(this->m_StringBuffer,0x4000,
           "{\"ph\":\"X\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"%s\",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%lu}},\n"
           ,((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)startTime) - 4503599627370496.0)) / 1000.0,
           ((auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0,
           this->m_ProcessId,name,name,id);
  std::ostream::write((char *)&this->m_TraceFile,(long)this->m_StringBuffer);
  return;
}

Assistant:

void CChromeTracer::writeDeviceTiming(
    const char* name,
    uint64_t startTime,
    uint64_t endTime,
    uint64_t id )
{
    if( m_AddFlowEvents )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"f\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"Command\""
            ",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%" PRIu64 "},\n",
            m_ProcessId,
            name,
            startTime / 1000.0,
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }

    int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
        "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"%s\""
        ",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%" PRIu64 "}},\n",
        m_ProcessId,
        name,
        name,
        startTime / 1000.0,
        (endTime - startTime) / 1000.0,
        id );
    m_TraceFile.write(m_StringBuffer, size);
}